

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.cpp
# Opt level: O1

RealType __thiscall OpenMD::NPTxyz::calcConservedQuantity(NPTxyz *this)

{
  Thermo *this_00;
  Mat3x3d *pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  SimInfo *this_01;
  RealType RVar10;
  RealType RVar11;
  double dVar12;
  int iVar13;
  double *pdVar14;
  uint i;
  long lVar15;
  Mat3x3d *pMVar16;
  double *pdVar17;
  uint j;
  long lVar18;
  Mat3x3d *pMVar19;
  uint k;
  long lVar20;
  double tmp_1;
  undefined1 auVar21 [16];
  pair<double,_double> pVar22;
  SquareMatrix3<double> result_1;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> result;
  double local_f8 [28];
  
  pVar22 = Snapshot::getThermostat
                     ((this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.
                      snap);
  (this->super_NPTf).super_NPT.thermostat.first = pVar22.first;
  (this->super_NPTf).super_NPT.thermostat.second = pVar22.second;
  (*(this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
    [0x18])(this);
  this_01 = (this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPTf).super_NPT.NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 *
       (this->super_NPTf).super_NPT.targetTemp;
  iVar9 = this_01->ndf_;
  iVar13 = SimInfo::getFdf(this_01);
  (this->super_NPTf).super_NPT.fkBT =
       (double)(iVar9 - iVar13) * 8.31451e-07 * (this->super_NPTf).super_NPT.targetTemp;
  this_00 = &(this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar10 = Thermo::getTotalEnergy(this_00);
  dVar2 = (this->super_NPTf).super_NPT.fkBT;
  dVar3 = (this->super_NPTf).super_NPT.tt2;
  dVar4 = (this->super_NPTf).super_NPT.thermostat.first;
  dVar12 = (this->super_NPTf).super_NPT.thermostat.second;
  pMVar1 = &(this->super_NPTf).eta;
  pdVar14 = local_f8 + 0x12;
  local_f8[0x18] = 0.0;
  local_f8[0x19] = 0.0;
  local_f8[0x16] = 0.0;
  local_f8[0x17] = 0.0;
  local_f8[0x14] = 0.0;
  local_f8[0x15] = 0.0;
  local_f8[0x12] = 0.0;
  local_f8[0x13] = 0.0;
  local_f8[0x1a] = 0.0;
  lVar15 = 0;
  pMVar16 = pMVar1;
  do {
    lVar18 = 0;
    pdVar17 = pdVar14;
    do {
      *pdVar17 = (pMVar16->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [lVar18];
      lVar18 = lVar18 + 1;
      pdVar17 = pdVar17 + 3;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    pdVar14 = pdVar14 + 1;
    pMVar16 = (Mat3x3d *)
              ((pMVar16->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar15 != 3);
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  pdVar14 = local_f8 + 0x12;
  lVar15 = 0;
  do {
    lVar18 = 0;
    pMVar16 = pMVar1;
    do {
      dVar5 = local_f8[lVar15 * 3 + lVar18];
      lVar20 = 0;
      pMVar19 = pMVar16;
      do {
        dVar5 = dVar5 + pdVar14[lVar20] *
                        (pMVar19->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0][0];
        lVar20 = lVar20 + 1;
        pMVar19 = (Mat3x3d *)
                  ((pMVar19->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar20 != 3);
      local_f8[lVar15 * 3 + lVar18] = dVar5;
      lVar18 = lVar18 + 1;
      pMVar16 = (Mat3x3d *)
                ((pMVar16->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    pdVar14 = pdVar14 + 3;
  } while (lVar15 != 3);
  lVar15 = 0;
  do {
    *(undefined8 *)((long)local_f8 + lVar15 + 0x58) =
         *(undefined8 *)((long)local_f8 + lVar15 + 0x10);
    *(undefined8 *)((long)local_f8 + lVar15 + 0x48) = *(undefined8 *)((long)local_f8 + lVar15);
    *(undefined8 *)((long)local_f8 + lVar15 + 0x50) = *(undefined8 *)((long)local_f8 + lVar15 + 8);
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  dVar5 = 0.0;
  lVar15 = 0;
  do {
    dVar5 = dVar5 + *(double *)((long)local_f8 + lVar15 + 0x48);
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0x60);
  dVar6 = (this->super_NPTf).super_NPT.NkBT;
  dVar7 = (this->super_NPTf).super_NPT.targetPressure;
  dVar8 = (this->super_NPTf).super_NPT.tb2;
  RVar11 = Thermo::getVolume(this_00);
  auVar21._0_8_ = dVar2 * dVar12;
  auVar21._8_8_ = dVar5 * dVar6 * dVar8;
  auVar21 = divpd(auVar21,_DAT_0029b040);
  return ((RVar11 * dVar7) / 163882576.0) / 0.0004184 +
         auVar21._8_8_ + RVar10 + (dVar3 * dVar2 * dVar4 * dVar4) / 0.0008368 + auVar21._0_8_;
}

Assistant:

RealType NPTxyz::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + thermostat_kinetic +
                        thermostat_potential + barostat_kinetic +
                        barostat_potential;

    return conservedQuantity;
  }